

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dumbfile.c
# Opt level: O0

void register_dumbfile_system(DUMBFILE_SYSTEM *dfs)

{
  DUMBFILE_SYSTEM *dfs_local;
  
  the_dfs = dfs;
  return;
}

Assistant:

void DUMBEXPORT register_dumbfile_system(const DUMBFILE_SYSTEM *dfs)
{
	ASSERT(dfs);
	ASSERT(dfs->open);
	ASSERT(dfs->getc);
	ASSERT(dfs->close);
    ASSERT(dfs->seek);
    ASSERT(dfs->get_size);
	the_dfs = dfs;
}